

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

gint tb_tc_cmp(gconstpointer ap,gconstpointer bp)

{
  bool bVar1;
  tb_tc *b;
  tb_tc *a;
  gconstpointer bp_local;
  gconstpointer ap_local;
  
  bVar1 = false;
  if (*(long *)((long)ap + 8) != 0) {
    bVar1 = *(long *)((long)bp + 8) != 0;
  }
  if (bVar1) {
    if (*bp < *ap) {
      ap_local._4_4_ = 1;
    }
    else if (*ap < *bp) {
      ap_local._4_4_ = -1;
    }
    else {
      if (*(long *)((long)ap + 8) != *(long *)((long)bp + 8)) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                   ,0x144,"a->size == b->size");
      }
      ap_local._4_4_ = 0;
    }
  }
  else if (*(long *)((long)ap + 8) == 0) {
    ap_local._4_4_ = ptr_cmp_tb_tc(*ap,(tb_tc *)bp);
  }
  else {
    ap_local._4_4_ = ptr_cmp_tb_tc(*bp,(tb_tc *)ap);
  }
  return ap_local._4_4_;
}

Assistant:

static gint tb_tc_cmp(gconstpointer ap, gconstpointer bp)
{
    const struct tb_tc *a = ap;
    const struct tb_tc *b = bp;

    /*
     * When both sizes are set, we know this isn't a lookup.
     * This is the most likely case: every TB must be inserted; lookups
     * are a lot less frequent.
     */
    if (likely(a->size && b->size)) {
        if (a->ptr > b->ptr) {
            return 1;
        } else if (a->ptr < b->ptr) {
            return -1;
        }
        /* a->ptr == b->ptr should happen only on deletions */
        g_assert(a->size == b->size);
        return 0;
    }
    /*
     * All lookups have either .size field set to 0.
     * From the glib sources we see that @ap is always the lookup key. However
     * the docs provide no guarantee, so we just mark this case as likely.
     */
    if (likely(a->size == 0)) {
        return ptr_cmp_tb_tc(a->ptr, b);
    }
    return ptr_cmp_tb_tc(b->ptr, a);
}